

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall mocker::Annotator::operator()(Annotator *this,FuncCallExpr *node)

{
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *puVar1;
  SemanticContext *pSVar2;
  PosPair PVar3;
  PosPair PVar4;
  ulong uVar5;
  bool bVar6;
  UnresolvableSymbol *this_00;
  element_type *peVar7;
  mapped_type *pmVar8;
  mapped_type *this_01;
  size_type sVar9;
  element_type *peVar10;
  size_type sVar11;
  InvalidFunctionCall *pIVar12;
  reference __r;
  __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *peVar13;
  __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  ASTNode *this_04;
  mapped_type *pmVar14;
  NodeID local_100;
  NodeID local_f8;
  shared_ptr<mocker::ast::Identifier> local_f0;
  SymTbl local_e0;
  undefined1 local_d0 [8];
  shared_ptr<mocker::ast::ClassDecl> decl;
  NodeID local_90;
  shared_ptr<mocker::ast::ASTNode> local_88;
  ulong local_78;
  size_t i;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  size_t sStack_50;
  NodeID local_48 [3];
  NodeID local_30;
  undefined1 local_28 [8];
  shared_ptr<mocker::ast::FuncDecl> funcDecl;
  FuncCallExpr *node_local;
  Annotator *this_local;
  
  funcDecl.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  setInstance(this,node);
  getFuncDecl((Annotator *)local_28,(FuncCallExpr *)this);
  bVar6 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (!bVar6) {
    this_00 = (UnresolvableSymbol *)__cxa_allocate_exception(0x68);
    puVar1 = this->pos;
    peVar7 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&funcDecl.
                              super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._M_use_count);
    local_30 = ast::ASTNode::getID(&peVar7->super_ASTNode);
    pmVar8 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::at(puVar1,&local_30);
    peVar7 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&funcDecl.
                              super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._M_use_count);
    UnresolvableSymbol::UnresolvableSymbol(this_00,pmVar8,&peVar7->val);
    __cxa_throw(this_00,&UnresolvableSymbol::typeinfo,UnresolvableSymbol::~UnresolvableSymbol);
  }
  pSVar2 = this->ctx;
  peVar7 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&funcDecl.
                          super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[2]._M_use_count);
  local_48[0] = ast::ASTNode::getID(&peVar7->super_ASTNode);
  this_01 = std::
            unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
            ::operator[](&pSVar2->associatedDecl,local_48);
  std::shared_ptr<mocker::ast::Declaration>::operator=
            (this_01,(shared_ptr<mocker::ast::FuncDecl> *)local_28);
  sVar9 = std::
          vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
          ::size((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  *)&funcDecl.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi[3]._M_use_count);
  peVar10 = std::
            __shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_28);
  sVar11 = std::
           vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ::size(&peVar10->formalParameters);
  if (sVar9 != sVar11) {
    pIVar12 = (InvalidFunctionCall *)__cxa_allocate_exception(0x48);
    puVar1 = this->pos;
    i = ast::ASTNode::getID((ASTNode *)
                            funcDecl.
                            super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
    pmVar8 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::at(puVar1,&i);
    local_68 = (pmVar8->first).line;
    sStack_60 = (pmVar8->first).col;
    local_58 = (pmVar8->second).line;
    sStack_50 = (pmVar8->second).col;
    PVar3.first = pmVar8->first;
    PVar3.second = pmVar8->second;
    InvalidFunctionCall::CompileError(pIVar12,PVar3);
    __cxa_throw(pIVar12,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  local_78 = 0;
  while( true ) {
    uVar5 = local_78;
    sVar9 = std::
            vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ::size((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                    *)&funcDecl.
                       super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[3]._M_use_count);
    if (sVar9 <= uVar5) {
      peVar10 = std::
                __shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_28);
      peVar7 = std::
               __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar10->identifier);
      bVar6 = std::operator==(&peVar7->val,"_ctor_");
      if (bVar6) {
        pSVar2 = this->ctx;
        std::__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&funcDecl.
                         super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi[2]._M_use_count);
        SymTbl::lookUp(&local_e0,(ScopeID *)&pSVar2->syms,(string *)&this->scopeResiding);
        std::static_pointer_cast<mocker::ast::ClassDecl,mocker::ast::Declaration>
                  ((shared_ptr<mocker::ast::Declaration> *)local_d0);
        std::shared_ptr<mocker::ast::Declaration>::~shared_ptr
                  ((shared_ptr<mocker::ast::Declaration> *)&local_e0);
        std::__shared_ptr_access<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_d0);
        std::make_shared<mocker::ast::UserDefinedType,std::shared_ptr<mocker::ast::Identifier>&>
                  (&local_f0);
        pSVar2 = this->ctx;
        local_f8 = ast::ASTNode::getID((ASTNode *)
                                       funcDecl.
                                       super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
        pmVar14 = std::
                  unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
                  ::operator[](&pSVar2->exprType,&local_f8);
        std::shared_ptr<mocker::ast::Type>::operator=
                  (pmVar14,(shared_ptr<mocker::ast::UserDefinedType> *)&local_f0);
        std::shared_ptr<mocker::ast::UserDefinedType>::~shared_ptr
                  ((shared_ptr<mocker::ast::UserDefinedType> *)&local_f0);
        std::shared_ptr<mocker::ast::ClassDecl>::~shared_ptr
                  ((shared_ptr<mocker::ast::ClassDecl> *)local_d0);
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_28);
        pSVar2 = this->ctx;
        local_100 = ast::ASTNode::getID((ASTNode *)
                                        funcDecl.
                                        super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
        pmVar14 = std::
                  unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
                  ::operator[](&pSVar2->exprType,&local_100);
        std::shared_ptr<mocker::ast::Type>::operator=(pmVar14,&peVar10->retType);
      }
      std::shared_ptr<mocker::ast::FuncDecl>::~shared_ptr
                ((shared_ptr<mocker::ast::FuncDecl> *)local_28);
      return;
    }
    __r = std::
          vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
          ::operator[]((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                        *)&funcDecl.
                           super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[3]._M_use_count,local_78);
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>(&local_88,__r);
    visit(this,&local_88);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_88);
    peVar10 = std::
              __shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    this_02 = (__shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                 ::operator[](&peVar10->formalParameters,local_78);
    peVar13 = std::
              __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_02);
    pSVar2 = this->ctx;
    this_03 = (__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                 ::operator[]((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                               *)&funcDecl.
                                  super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi[3]._M_use_count,local_78);
    this_04 = &std::
               __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_03)->super_ASTNode;
    local_90 = ast::ASTNode::getID(this_04);
    pmVar14 = std::
              unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
              ::operator[](&pSVar2->exprType,&local_90);
    bVar6 = assignable(this,&peVar13->type,pmVar14);
    if (((bVar6 ^ 0xffU) & 1) != 0) break;
    local_78 = local_78 + 1;
  }
  pIVar12 = (InvalidFunctionCall *)__cxa_allocate_exception(0x48);
  puVar1 = this->pos;
  decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ast::ASTNode::getID(funcDecl.
                           super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  pmVar8 = std::
           unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
           ::at(puVar1,(key_type *)
                       &decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
  PVar4.first = pmVar8->first;
  PVar4.second = pmVar8->second;
  InvalidFunctionCall::CompileError(pIVar12,PVar4);
  __cxa_throw(pIVar12,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
}

Assistant:

void operator()(ast::FuncCallExpr &node) const override {
    setInstance(node);
    auto funcDecl = getFuncDecl(node);
    if (!funcDecl)
      throw UnresolvableSymbol(pos.at(node.identifier->getID()),
                               node.identifier->val);

    ctx.associatedDecl[node.identifier->getID()] = funcDecl;

    if (node.args.size() != funcDecl->formalParameters.size())
      throw InvalidFunctionCall(pos.at(node.getID()));
    for (std::size_t i = 0; i < node.args.size(); ++i) {
      visit(node.args[i]);
      if (!assignable(funcDecl->formalParameters[i]->type,
                      ctx.exprType[node.args[i]->getID()]))
        throw InvalidFunctionCall(pos.at(node.getID()));
    }

    if (funcDecl->identifier->val == "_ctor_") {
      auto decl = std::static_pointer_cast<ast::ClassDecl>(
          ctx.syms.lookUp(scopeResiding, node.identifier->val));
      ctx.exprType[node.getID()] =
          std::make_shared<ast::UserDefinedType>(decl->identifier);
    } else {
      ctx.exprType[node.getID()] = funcDecl->retType;
    }
  }